

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_memory_editor.h
# Opt level: O0

void __thiscall
MemoryEditor::CalcSizes(MemoryEditor *this,Sizes *s,size_t mem_size,size_t base_display_addr)

{
  ImGuiStyle *pIVar1;
  float fVar2;
  ImVec2 IVar3;
  float local_40;
  ulong local_38;
  size_t n;
  ImGuiStyle *style;
  size_t base_display_addr_local;
  size_t mem_size_local;
  Sizes *s_local;
  MemoryEditor *this_local;
  
  pIVar1 = ImGui::GetStyle();
  s->AddrDigitsCount = this->OptAddrDigitsCount;
  if (s->AddrDigitsCount == 0) {
    for (local_38 = (base_display_addr + mem_size) - 1; local_38 != 0; local_38 = local_38 >> 4) {
      s->AddrDigitsCount = s->AddrDigitsCount + 1;
    }
  }
  fVar2 = ImGui::GetTextLineHeight();
  s->LineHeight = fVar2;
  IVar3 = ImGui::CalcTextSize("F",(char *)0x0,false,-1.0);
  local_40 = IVar3.x;
  s->GlyphWidth = local_40 + 1.0;
  s->HexCellWidth = (float)(int)(s->GlyphWidth * 2.5);
  s->SpacingBetweenMidCols = (float)(int)(s->HexCellWidth * 0.25);
  s->PosHexStart = (float)(s->AddrDigitsCount + 2) * s->GlyphWidth;
  s->PosHexEnd = s->HexCellWidth * (float)this->Cols + s->PosHexStart;
  s->PosAsciiEnd = s->PosHexEnd;
  s->PosAsciiStart = s->PosHexEnd;
  if ((this->OptShowAscii & 1U) != 0) {
    s->PosAsciiStart = s->GlyphWidth + s->PosHexEnd;
    if (0 < this->OptMidColsCount) {
      s->PosAsciiStart =
           (float)((this->Cols + this->OptMidColsCount + -1) / this->OptMidColsCount) *
           s->SpacingBetweenMidCols + s->PosAsciiStart;
    }
    s->PosAsciiEnd = (float)this->Cols * s->GlyphWidth + s->PosAsciiStart;
  }
  fVar2 = (pIVar1->WindowPadding).x;
  s->WindowWidth = fVar2 + fVar2 + s->PosAsciiEnd + pIVar1->ScrollbarSize + s->GlyphWidth;
  return;
}

Assistant:

void CalcSizes(Sizes& s, size_t mem_size, size_t base_display_addr)
    {
        ImGuiStyle& style = ImGui::GetStyle();
        s.AddrDigitsCount = OptAddrDigitsCount;
        if (s.AddrDigitsCount == 0)
            for (size_t n = base_display_addr + mem_size - 1; n > 0; n >>= 4)
                s.AddrDigitsCount++;
        s.LineHeight = ImGui::GetTextLineHeight();
        s.GlyphWidth = ImGui::CalcTextSize("F").x + 1;                  // We assume the font is mono-space
        s.HexCellWidth = (float)(int)(s.GlyphWidth * 2.5f);             // "FF " we include trailing space in the width to easily catch clicks everywhere
        s.SpacingBetweenMidCols = (float)(int)(s.HexCellWidth * 0.25f); // Every OptMidColsCount columns we add a bit of extra spacing
        s.PosHexStart = (s.AddrDigitsCount + 2) * s.GlyphWidth;
        s.PosHexEnd = s.PosHexStart + (s.HexCellWidth * Cols);
        s.PosAsciiStart = s.PosAsciiEnd = s.PosHexEnd;
        if (OptShowAscii)
        {
            s.PosAsciiStart = s.PosHexEnd + s.GlyphWidth * 1;
            if (OptMidColsCount > 0)
                s.PosAsciiStart += (float)((Cols + OptMidColsCount - 1) / OptMidColsCount) * s.SpacingBetweenMidCols;
            s.PosAsciiEnd = s.PosAsciiStart + Cols * s.GlyphWidth;
        }
        s.WindowWidth = s.PosAsciiEnd + style.ScrollbarSize + style.WindowPadding.x * 2 + s.GlyphWidth;
    }